

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

bool subhomedir(char *dst,int len,char *src)

{
  char *s;
  long lVar1;
  char *home;
  char *sub;
  char *src_local;
  int len_local;
  char *dst_local;
  
  home = strstr(src,"$HOME");
  if (home == (char *)0x0) {
    home = strchr(src,0x7e);
  }
  if ((home != (char *)0x0) && ((long)home - (long)src < (long)len)) {
    s = getenv("HOME");
    if ((s == (char *)0x0) || (*s == '\0')) {
      return false;
    }
    dst[(long)home - (long)src] = '\0';
    concatstring(dst,s,0x104);
    lVar1 = 5;
    if (*home == '~') {
      lVar1 = 1;
    }
    concatstring(dst,home + lVar1,0x104);
  }
  return true;
}

Assistant:

bool subhomedir(char *dst, int len, const char *src)
{
    const char *sub = strstr(src, "$HOME");
    if(!sub) sub = strchr(src, '~');
    if(sub && sub-src < len)
    {
#ifdef WIN32
        char home[MAX_PATH+1];
        home[0] = '\0';
        if(SHGetFolderPath(NULL, CSIDL_PERSONAL, NULL, 0, home) != S_OK || !home[0]) return false;
#else
        const char *home = getenv("HOME");
        if(!home || !home[0]) return false;
#endif
        dst[sub-src] = '\0';
        concatstring(dst, home);
        concatstring(dst, sub+(*sub == '~' ? 1 : strlen("$HOME")));
    }
    return true;
}